

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cpplocate::libExtensions_abi_cxx11_(void)

{
  ulong __n;
  reference this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  _anonymous_namespace_ local_58 [32];
  uint local_38;
  uint i;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_26;
  undefined1 local_25;
  uint local_24;
  uint *puStack_20;
  uint count;
  uint *lengths;
  char **extensions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  lengths = (uint *)0x0;
  puStack_20 = (uint *)0x0;
  local_24 = 0;
  ::libExtensions((char ***)&lengths,&stack0xffffffffffffffe0,&local_24);
  local_25 = 0;
  __n = (ulong)local_24;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_26);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI,__n,&local_26);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_26);
  for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
    (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
              (local_58,*(char **)(lengths + (ulong)local_38 * 2),puStack_20[local_38]);
    this = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,(ulong)local_38);
    std::__cxx11::string::operator=((string *)this,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  if (local_24 != 0) {
    free(lengths);
    free(puStack_20);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> libExtensions()
{
    char ** extensions = nullptr;
    unsigned int * lengths = nullptr;
    unsigned int count = 0;

    ::libExtensions(&extensions, &lengths, &count);

    // Convert c-array of c-strings and handle memory ownership
    auto result = std::vector<std::string>(count);

    for (auto i = 0u; i < count; ++i)
    {
        // Convert to string and free memory from liblocate
        result[i] = obtainStringFromLibLocate(extensions[i], lengths[i]);
    }

    if (count > 0)
    {
        free(extensions);
        free(lengths);
    }

    return result;
}